

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.cpp
# Opt level: O2

void __thiscall
program_options::command_line_parser::command_line_parser
          (command_line_parser *this,int argc,char **argv)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  
  (this->m_rawArguments).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_options_description = (options_description *)0x0;
  (this->m_rawArguments).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_rawArguments).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->m_positional_options_description = (positional_options_description *)0x0;
  (this->m_executableName)._M_dataplus._M_p = (pointer)&(this->m_executableName).field_2;
  (this->m_executableName)._M_string_length = 0;
  (this->m_executableName).field_2._M_local_buf[0] = '\0';
  if (0 < argc) {
    std::__cxx11::string::assign((char *)&this->m_executableName);
  }
  uVar2 = argc - 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(&this->m_rawArguments,(long)(int)uVar2);
  uVar1 = 0;
  uVar3 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar3 = uVar1;
  }
  for (; uVar3 * 0x20 != uVar1; uVar1 = uVar1 + 0x20) {
    std::__cxx11::string::assign
              ((char *)((long)&(((this->m_rawArguments).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       uVar1));
  }
  this->m_style = default_style;
  this->m_allow_unregistered = false;
  return;
}

Assistant:

command_line_parser::command_line_parser(int argc, const char* const argv[]) {
    if (argc > 0) {
        m_executableName = argv[0];
    }

    m_rawArguments.resize(argc-1);
    for (int i = 0; i < argc-1; i++) {
        m_rawArguments[i] = argv[i+1];
    }

    m_style = command_line_style::default_style;
    m_allow_unregistered = false;
}